

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Value * duckdb::Value::AGGREGATE_STATE
                  (Value *__return_storage_ptr__,LogicalType *type,const_data_ptr_t data,idx_t len)

{
  undefined1 auStack_68 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  undefined1 local_48 [16];
  LogicalType local_38;
  
  LogicalType::LogicalType(&local_38,type);
  Value(__return_storage_ptr__,&local_38);
  LogicalType::~LogicalType(&local_38);
  __return_storage_ptr__->is_null = false;
  local_58._M_allocated_capacity = (size_type)local_48;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_68 + 0x10),data,data + len);
  make_shared_ptr<duckdb::StringValueInfo,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_68);
  shared_ptr<duckdb::ExtraValueInfo,_true>::operator=<duckdb::StringValueInfo,_0>
            (&__return_storage_ptr__->value_info_,
             (shared_ptr<duckdb::StringValueInfo,_true> *)auStack_68);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_68 + 8));
  ::std::__cxx11::string::~string((string *)(auStack_68 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

Value Value::AGGREGATE_STATE(const LogicalType &type, const_data_ptr_t data, idx_t len) { // NOLINT
	Value result(type);
	result.is_null = false;
	result.value_info_ = make_shared_ptr<StringValueInfo>(string(const_char_ptr_cast(data), len));
	return result;
}